

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O3

int Cec_ManSeqResimulate(Cec_ManSim_t *p,Vec_Ptr_t *vInfo)

{
  Gia_Man_t *pGVar1;
  Cec_ParSim_t *pCVar2;
  void *pvVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  Vec_Ptr_t *vInfoCos;
  uint uVar10;
  Vec_Ptr_t *vInfoCis;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  
  pGVar1 = p->pAig;
  pCVar2 = p->pPars;
  iVar8 = pGVar1->nRegs;
  iVar15 = pCVar2->nFrames;
  if (vInfo->nSize != (pGVar1->vCis->nSize - iVar8) * iVar15 + iVar8) {
    __assert_fail("Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x8e,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
  }
  uVar16 = 0;
  if (0 < iVar8) {
    do {
      if ((((long)vInfo->nSize <= (long)uVar16) ||
          (uVar10 = (int)uVar16 + (pGVar1->vCos->nSize - iVar8), (int)uVar10 < 0)) ||
         (p->vCoSimInfo->nSize <= (int)uVar10)) {
LAB_0065e68a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (0 < p->nWords) {
        pvVar3 = vInfo->pArray[uVar16];
        pvVar4 = p->vCoSimInfo->pArray[uVar10];
        lVar11 = 0;
        do {
          *(undefined4 *)((long)pvVar4 + lVar11 * 4) = *(undefined4 *)((long)pvVar3 + lVar11 * 4);
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nWords);
        iVar8 = pGVar1->nRegs;
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)iVar8);
    iVar15 = pCVar2->nFrames;
  }
  iVar8 = (int)uVar16;
  if (0 < iVar15) {
    iVar15 = 0;
    do {
      pGVar1 = p->pAig;
      pVVar5 = pGVar1->vCis;
      iVar7 = pGVar1->nRegs;
      iVar8 = pVVar5->nSize;
      if (iVar7 < iVar8) {
        uVar9 = uVar16 & 0xffffffff;
        lVar11 = 0;
        do {
          if ((((int)uVar16 < 0) || (vInfo->nSize <= (int)uVar9)) ||
             (p->vCiSimInfo->nSize <= lVar11)) goto LAB_0065e68a;
          if (0 < p->nWords) {
            pvVar3 = vInfo->pArray[uVar9];
            pvVar4 = p->vCiSimInfo->pArray[lVar11];
            lVar13 = 0;
            do {
              *(undefined4 *)((long)pvVar4 + lVar13 * 4) =
                   *(undefined4 *)((long)pvVar3 + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (lVar13 < p->nWords);
            iVar7 = pGVar1->nRegs;
            iVar8 = pVVar5->nSize;
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar8 - iVar7);
        uVar16 = uVar9 & 0xffffffff;
      }
      iVar8 = (int)uVar16;
      if (iVar7 < 1) {
        vInfoCis = p->vCiSimInfo;
        vInfoCos = p->vCoSimInfo;
      }
      else {
        vInfoCos = p->vCoSimInfo;
        pVVar6 = pGVar1->vCos;
        iVar12 = 0;
        do {
          uVar10 = (pVVar6->nSize - iVar7) + iVar12;
          if ((((int)uVar10 < 0) || (vInfoCos->nSize <= (int)uVar10)) ||
             ((uVar14 = (pVVar5->nSize - iVar7) + iVar12, (int)uVar14 < 0 ||
              (vInfoCis = p->vCiSimInfo, vInfoCis->nSize <= (int)uVar14)))) goto LAB_0065e68a;
          if (0 < p->nWords) {
            pvVar3 = vInfoCos->pArray[uVar10];
            pvVar4 = vInfoCis->pArray[uVar14];
            lVar11 = 0;
            do {
              *(undefined4 *)((long)pvVar4 + lVar11 * 4) =
                   *(undefined4 *)((long)pvVar3 + lVar11 * 4);
              lVar11 = lVar11 + 1;
            } while (lVar11 < p->nWords);
            iVar7 = pGVar1->nRegs;
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < iVar7);
      }
      iVar7 = Cec_ManSimSimulateRound(p,vInfoCis,vInfoCos);
      if (iVar7 != 0) {
        return 1;
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < p->pPars->nFrames);
  }
  if (iVar8 == vInfo->nSize) {
    return 0;
  }
  __assert_fail("k == Vec_PtrSize(vInfo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                ,0xa9,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
}

Assistant:

int Cec_ManSeqResimulate( Cec_ManSim_t * p, Vec_Ptr_t * vInfo )
{
    unsigned * pInfo0, * pInfo1;
    int f, i, k, w;
//    assert( Gia_ManRegNum(p->pAig) > 0 );
    assert( Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames );
    for ( k = 0; k < Gia_ManRegNum(p->pAig); k++ )
    {
        pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k );
        pInfo1 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + k );
        for ( w = 0; w < p->nWords; w++ )
            pInfo1[w] = pInfo0[w];
    }
    for ( f = 0; f < p->pPars->nFrames; f++ )
    {
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k++ );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + i );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    assert( k == Vec_PtrSize(vInfo) );
    return 0;
}